

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
HdlcSimulationDataGenerator::CreateHDLCFrame
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *address,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *control,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *information)

{
  HdlcSimulationDataGenerator *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> allFields;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fcs;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (uchar *)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,(const_iterator)0x0,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(address->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(address->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(control->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  this_00 = (HdlcSimulationDataGenerator *)local_48._M_impl.super__Vector_impl_data._M_finish;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(information->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(information->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  GenFcs((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,this_00,
         this->mSettings->mHdlcFcs,
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_48,
             (const_iterator)local_48._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_30._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_30._M_impl.super__Vector_impl_data._M_finish);
  if (this->mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    TransmitBitSync(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  }
  else {
    TransmitByteAsync(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::CreateHDLCFrame( const vector<U8>& address, const vector<U8>& control, const vector<U8>& information )
{
    vector<U8> allFields;

    allFields.insert( allFields.end(), address.begin(), address.end() );
    allFields.insert( allFields.end(), control.begin(), control.end() );
    allFields.insert( allFields.end(), information.begin(), information.end() );

    // Calculate the crc of the address, control and data fields
    vector<U8> fcs = GenFcs( mSettings->mHdlcFcs, allFields );
    allFields.insert( allFields.end(), fcs.begin(), fcs.end() );

    // Transmit the frame in bit-sync or byte-async
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        TransmitBitSync( allFields );
    }
    else
    {
        TransmitByteAsync( allFields );
    }
}